

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O2

void __thiscall duckdb::CreateTableInfo::CreateTableInfo(CreateTableInfo *this)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_4b71df5 + 9,&local_59);
  ::std::__cxx11::string::string((string *)&local_58,anon_var_dwarf_4b71df5 + 9,&local_5a);
  CreateInfo::CreateInfo(&this->super_CreateInfo,TABLE_ENTRY,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableInfo_0178f0b0;
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  (this->table)._M_string_length = 0;
  (this->table).field_2._M_local_buf[0] = '\0';
  ColumnList::ColumnList(&this->columns,false);
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

CreateTableInfo::CreateTableInfo() : CreateInfo(CatalogType::TABLE_ENTRY, INVALID_SCHEMA) {
}